

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResonanceParameters.test.cpp
# Opt level: O3

void verifyChunk(ResonanceParameters *chunk)

{
  _Head_base<3UL,_long,_false> *p_Var1;
  vector<double,_std::allocator<double>_> *pvVar2;
  pointer pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  member_size_t<ranges::ref_view<const_std::vector<double>_>_&> n;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  pointer *ppdVar13;
  unsigned_long n_2;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef macroName_70;
  StringRef macroName_71;
  StringRef macroName_72;
  StringRef macroName_73;
  StringRef macroName_74;
  StringRef macroName_75;
  StringRef macroName_76;
  StringRef macroName_77;
  StringRef macroName_78;
  StringRef macroName_79;
  StringRef macroName_80;
  StringRef macroName_81;
  StringRef macroName_82;
  StringRef macroName_83;
  StringRef macroName_84;
  StringRef macroName_85;
  StringRef macroName_86;
  StringRef macroName_87;
  StringRef macroName_88;
  StringRef macroName_89;
  StringRef macroName_90;
  StringRef macroName_91;
  StringRef macroName_92;
  StringRef macroName_93;
  StringRef macroName_94;
  StringRef macroName_95;
  StringRef macroName_96;
  StringRef macroName_97;
  StringRef macroName_98;
  StringRef macroName_99;
  StringRef macroName_x00100;
  StringRef macroName_x00101;
  StringRef macroName_x00102;
  StringRef macroName_x00103;
  StringRef macroName_x00104;
  StringRef macroName_x00105;
  StringRef macroName_x00106;
  StringRef macroName_x00107;
  StringRef macroName_x00108;
  StringRef macroName_x00109;
  StringRef macroName_x00110;
  StringRef macroName_x00111;
  StringRef macroName_x00112;
  StringRef macroName_x00113;
  StringRef macroName_x00114;
  StringRef macroName_x00115;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  StringRef capturedExpression_70;
  StringRef capturedExpression_71;
  StringRef capturedExpression_72;
  StringRef capturedExpression_73;
  StringRef capturedExpression_74;
  StringRef capturedExpression_75;
  StringRef capturedExpression_76;
  StringRef capturedExpression_77;
  StringRef capturedExpression_78;
  StringRef capturedExpression_79;
  StringRef capturedExpression_80;
  StringRef capturedExpression_81;
  StringRef capturedExpression_82;
  StringRef capturedExpression_83;
  StringRef capturedExpression_84;
  StringRef capturedExpression_85;
  StringRef capturedExpression_86;
  StringRef capturedExpression_87;
  StringRef capturedExpression_88;
  StringRef capturedExpression_89;
  StringRef capturedExpression_90;
  StringRef capturedExpression_91;
  StringRef capturedExpression_92;
  StringRef capturedExpression_93;
  StringRef capturedExpression_94;
  StringRef capturedExpression_95;
  StringRef capturedExpression_96;
  StringRef capturedExpression_97;
  StringRef capturedExpression_98;
  StringRef capturedExpression_99;
  StringRef capturedExpression_x00100;
  StringRef capturedExpression_x00101;
  StringRef capturedExpression_x00102;
  StringRef capturedExpression_x00103;
  StringRef capturedExpression_x00104;
  StringRef capturedExpression_x00105;
  StringRef capturedExpression_x00106;
  StringRef capturedExpression_x00107;
  StringRef capturedExpression_x00108;
  StringRef capturedExpression_x00109;
  StringRef capturedExpression_x00110;
  StringRef capturedExpression_x00111;
  StringRef capturedExpression_x00112;
  StringRef capturedExpression_x00113;
  StringRef capturedExpression_x00114;
  StringRef capturedExpression_x00115;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_5e0;
  undefined1 local_598 [8];
  undefined8 local_590;
  iterator_t<CRng>_conflict1 *local_588;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_580 [2];
  undefined1 local_560 [8];
  undefined8 local_558;
  ITransientExpression *local_550;
  sentinel_t<CRng> local_548;
  undefined8 *local_540;
  undefined1 *local_538;
  undefined1 local_530 [8];
  undefined8 local_528;
  char *local_520;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_518;
  double local_508;
  double local_500;
  undefined8 local_4f8;
  undefined1 local_4f0;
  undefined1 local_4ef;
  iterator_t<CRng>_conflict1 local_4e8;
  undefined8 *local_4c8;
  undefined1 *local_4c0;
  iterator_t<CRng>_conflict1 local_4b8;
  undefined8 *local_498;
  undefined1 *local_490;
  double local_488;
  iterator_t<CRng> local_480;
  undefined1 *local_478;
  iterator_t<CRng> local_470;
  undefined1 *local_468;
  iterator_t<CRng> local_460;
  undefined1 *local_458;
  iterator_t<CRng> local_450;
  undefined1 *local_448;
  ITransientExpression local_440;
  double *local_430;
  WithinRelMatcher *local_428;
  iterator_t<CRng>_conflict1 local_420;
  undefined8 *local_400;
  undefined1 *local_3f8;
  iterator_t<CRng>_conflict1 local_3f0;
  undefined8 *local_3d0;
  undefined1 *local_3c8;
  iterator_t<CRng>_conflict1 local_3c0;
  undefined8 *local_3a0;
  undefined1 *local_398;
  iterator_t<CRng>_conflict1 local_390;
  undefined8 *local_370;
  undefined1 *local_368;
  iterator_t<CRng>_conflict1 local_360;
  undefined8 *local_340;
  undefined1 *local_338;
  iterator_t<CRng>_conflict1 local_330;
  undefined8 *local_310;
  undefined1 *local_308;
  iterator_t<CRng>_conflict1 local_300;
  undefined8 *local_2e0;
  undefined1 *local_2d8;
  iterator_t<CRng>_conflict1 local_2d0;
  undefined8 *local_2b0;
  undefined1 *local_2a8;
  iterator_t<CRng>_conflict1 local_2a0;
  undefined8 *local_280;
  undefined1 *local_278;
  iterator_t<CRng>_conflict1 local_270;
  undefined8 *local_250;
  undefined1 *local_248;
  iterator_t<CRng>_conflict1 local_240;
  undefined8 *local_220;
  undefined1 *local_218;
  iterator_t<CRng>_conflict1 local_210;
  undefined8 *local_1f0;
  undefined1 *local_1e8;
  iterator_t<CRng>_conflict1 local_1e0;
  undefined8 *local_1c0;
  undefined1 *local_1b8;
  iterator_t<CRng>_conflict1 local_1b0;
  undefined8 *local_190;
  undefined1 *local_188;
  iterator_t<CRng>_conflict1 local_180;
  undefined8 *local_160;
  undefined1 *local_158;
  iterator_t<CRng>_conflict1 local_150;
  undefined8 *local_130;
  undefined1 *local_128;
  iterator_t<CRng>_conflict1 local_120;
  undefined8 *local_100;
  undefined1 *local_f8;
  iterator_t<CRng>_conflict1 local_f0;
  undefined8 *local_d0;
  undefined1 *local_c8;
  iterator_t<CRng>_conflict1 local_c0;
  undefined8 *local_a0;
  undefined1 *local_98;
  iterator_t<CRng>_conflict1 local_90;
  undefined8 *local_70;
  undefined1 *local_68;
  iterator_t<CRng>_conflict1 local_60;
  undefined8 *local_40;
  undefined1 *local_38;
  
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xbb;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "2 == chunk.NRSA()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName,(SourceLineInfo *)local_530,capturedExpression,ContinueOnFailure);
  local_518._8_8_ =
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da360;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  p_Var1 = &(chunk->super_ListRecord).metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>;
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xbc;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1d;
  capturedExpression_00.m_start = "2 == chunk.numberResonances()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_00,(SourceLineInfo *)local_530,capturedExpression_00,
             ContinueOnFailure);
  local_518._8_8_ = p_Var1->_M_head_impl;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da360;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xbd;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0xf;
  capturedExpression_01.m_start = "4 == chunk.NX()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_01,(SourceLineInfo *)local_530,capturedExpression_01,
             ContinueOnFailure);
  lVar9 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = lVar9 / 0xc;
  local_528._1_1_ = lVar9 - 0x30U < 0xc;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da360;
  local_528._4_4_ = 4;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  pvVar2 = &(chunk->super_ListRecord).data;
  ppdVar13 = &(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xbe;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x18;
  capturedExpression_02.m_start = "4 == chunk.numberLines()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_02,(SourceLineInfo *)local_530,capturedExpression_02,
             ContinueOnFailure);
  lVar9 = (long)*ppdVar13 -
          (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = lVar9 / 0xc;
  local_528._1_1_ = lVar9 - 0x30U < 0xc;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da360;
  local_528._4_4_ = 4;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc0;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x16;
  capturedExpression_03.m_start = "2 == chunk.ER().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_03,(SourceLineInfo *)local_530,capturedExpression_03,
             ContinueOnFailure);
  lVar9 = (long)*ppdVar13 -
          (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar11 = ((lVar9 / 0xc) / p_Var1->_M_head_impl) * 0xc;
  local_518._8_8_ = ((lVar9 + uVar11) - 1) / uVar11;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc1;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x25;
  capturedExpression_04.m_start = "2 == chunk.resonanceEnergies().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_04,(SourceLineInfo *)local_530,capturedExpression_04,
             ContinueOnFailure);
  lVar9 = (long)*ppdVar13 -
          (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  uVar11 = ((lVar9 / 0xc) / p_Var1->_M_head_impl) * 0xc;
  local_518._8_8_ = ((lVar9 + uVar11) - 1) / uVar11;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc2;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x17;
  capturedExpression_05.m_start = "2 == chunk.GAM().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_05,(SourceLineInfo *)local_530,capturedExpression_05,
             ContinueOnFailure);
  uVar10 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  uVar11 = (((long)uVar10 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_518._8_8_ = (uVar10 / uVar11 - (ulong)(uVar10 % uVar11 == 0)) + 2 >> 1;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc3;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x27;
  capturedExpression_06.m_start = "2 == chunk.resonanceParameters().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_06,(SourceLineInfo *)local_530,capturedExpression_06,
             ContinueOnFailure);
  uVar10 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  uVar11 = (((long)uVar10 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_518._8_8_ = (uVar10 / uVar11 - (ulong)(uVar10 % uVar11 == 0)) + 2 >> 1;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc4;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x17;
  capturedExpression_07.m_start = "2 == chunk.DER().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_07,(SourceLineInfo *)local_530,capturedExpression_07,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 0xc;
  local_518._8_8_ = ((((long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3) + uVar11) - 1) / uVar11;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc5;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x30;
  capturedExpression_08.m_start = "2 == chunk.resonanceEnergyUncertainties().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_08,(SourceLineInfo *)local_530,capturedExpression_08,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 0xc;
  local_518._8_8_ = ((((long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3) + uVar11) - 1) / uVar11;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc6;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x18;
  capturedExpression_09.m_start = "2 == chunk.DGAM().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_09,(SourceLineInfo *)local_530,capturedExpression_09,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 6;
  uVar10 = (long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3;
  local_518._8_8_ = (uVar10 / uVar11 - (ulong)(uVar10 % uVar11 == 0)) + 2 >> 1;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc7;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x33;
  capturedExpression_10.m_start = "2 == chunk.resonanceParameterUncertainties().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_10,(SourceLineInfo *)local_530,capturedExpression_10,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 6;
  uVar10 = (long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3;
  local_518._8_8_ = (uVar10 / uVar11 - (ulong)(uVar10 % uVar11 == 0)) + 2 >> 1;
  local_528._1_1_ = local_518._8_8_ == 2;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 2;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xc9;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x28;
  capturedExpression_11.m_start = "-1.223300e+6, WithinRel( chunk.ER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_11,(SourceLineInfo *)local_530,capturedExpression_11,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0xc132aa8400000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             *(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xca;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x27;
  capturedExpression_12.m_start = "7.788000e+3, WithinRel( chunk.ER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_12,(SourceLineInfo *)local_530,capturedExpression_12,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x40be6c0000000000;
  local_480._M_current =
       (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  lVar9 = (long)*ppdVar13 - (long)local_480._M_current >> 3;
  local_550 = (ITransientExpression *)(((lVar9 / 0xc) / p_Var1->_M_head_impl) * 0xc);
  auVar4._8_8_ = (long)*ppdVar13 - (long)local_480._M_current >> 0x3f;
  auVar4._0_8_ = lVar9;
  lVar9 = SUB168(auVar4 % SEXT816((long)local_550),0);
  local_548._M_current = (double *)((long)local_550 - lVar9);
  if (lVar9 == 0) {
    local_548._M_current = (double *)0x0;
  }
  local_558 = (long)pvVar2;
  local_478 = local_560;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_478,&local_480,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_530,*local_480._M_current);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)&local_4e8);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = &local_4e8;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xcb;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x37;
  capturedExpression_13.m_start = "-1.223300e+6, WithinRel( chunk.resonanceEnergies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_13,(SourceLineInfo *)local_530,capturedExpression_13,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0xc132aa8400000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             *(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xcc;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x36;
  capturedExpression_14.m_start = "7.788000e+3, WithinRel( chunk.resonanceEnergies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_14,(SourceLineInfo *)local_530,capturedExpression_14,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x40be6c0000000000;
  local_470._M_current =
       (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  lVar9 = (long)*ppdVar13 - (long)local_470._M_current >> 3;
  local_550 = (ITransientExpression *)(((lVar9 / 0xc) / p_Var1->_M_head_impl) * 0xc);
  auVar5._8_8_ = (long)*ppdVar13 - (long)local_470._M_current >> 0x3f;
  auVar5._0_8_ = lVar9;
  lVar9 = SUB168(auVar5 % SEXT816((long)local_550),0);
  local_548._M_current = (double *)((long)local_550 - lVar9);
  if (lVar9 == 0) {
    local_548._M_current = (double *)0x0;
  }
  local_558 = (long)pvVar2;
  local_468 = local_560;
  ranges::stride_view<ranges::ref_view<std::vector<double,std::allocator<double>>const>>::
  adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_468,&local_470,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_530,*local_470._M_current);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)&local_4e8);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = &local_4e8;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xcd;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x1b;
  capturedExpression_15.m_start = "11 == chunk.GAM()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_15,(SourceLineInfo *)local_530,capturedExpression_15,
             ContinueOnFailure);
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)local_560,(range_difference_t<D<true>_>)local_530);
  local_580[0]._8_8_ = (long)local_560 - local_558 >> 3;
  local_590._1_1_ = (long)local_560 - local_558 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xce;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x1b;
  capturedExpression_16.m_start = "11 == chunk.GAM()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_16,(SourceLineInfo *)local_530,capturedExpression_16,
             ContinueOnFailure);
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)local_560,(range_difference_t<D<true>_>)local_530);
  local_580[0]._8_8_ = (long)local_560 - local_558 >> 3;
  local_590._1_1_ = (long)local_560 - local_558 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xcf;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x22;
  capturedExpression_17.m_start = "1., WithinRel( chunk.GAM()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_17,(SourceLineInfo *)local_530,capturedExpression_17,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3ff0000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              local_4e8.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
              .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd0;
  macroName_18.m_size = 10;
  macroName_18.m_start = "CHECK_THAT";
  capturedExpression_18.m_size = 0x2b;
  capturedExpression_18.m_start = "9.611086e+5, WithinRel( chunk.GAM()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_18,(SourceLineInfo *)local_530,capturedExpression_18,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x412d54a933333333;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd1;
  macroName_19.m_size = 10;
  macroName_19.m_start = "CHECK_THAT";
  capturedExpression_19.m_size = 0x22;
  capturedExpression_19.m_start = "2., WithinRel( chunk.GAM()[0][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_19,(SourceLineInfo *)local_530,capturedExpression_19,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4000000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd2;
  macroName_20.m_size = 10;
  macroName_20.m_start = "CHECK_THAT";
  capturedExpression_20.m_size = 0x22;
  capturedExpression_20.m_start = "3., WithinRel( chunk.GAM()[0][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_20,(SourceLineInfo *)local_530,capturedExpression_20,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4008000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd3;
  macroName_21.m_size = 10;
  macroName_21.m_start = "CHECK_THAT";
  capturedExpression_21.m_size = 0x22;
  capturedExpression_21.m_start = "4., WithinRel( chunk.GAM()[0][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_21,(SourceLineInfo *)local_530,capturedExpression_21,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4010000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd4;
  macroName_22.m_size = 10;
  macroName_22.m_start = "CHECK_THAT";
  capturedExpression_22.m_size = 0x22;
  capturedExpression_22.m_start = "5., WithinRel( chunk.GAM()[0][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_22,(SourceLineInfo *)local_530,capturedExpression_22,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4014000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd5;
  macroName_23.m_size = 10;
  macroName_23.m_start = "CHECK_THAT";
  capturedExpression_23.m_size = 0x22;
  capturedExpression_23.m_start = "0., WithinRel( chunk.GAM()[0][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_23,(SourceLineInfo *)local_530,capturedExpression_23,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd6;
  macroName_24.m_size = 10;
  macroName_24.m_start = "CHECK_THAT";
  capturedExpression_24.m_size = 0x22;
  capturedExpression_24.m_start = "0., WithinRel( chunk.GAM()[0][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_24,(SourceLineInfo *)local_530,capturedExpression_24,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd7;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x22;
  capturedExpression_25.m_start = "0., WithinRel( chunk.GAM()[0][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_25,(SourceLineInfo *)local_530,capturedExpression_25,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd8;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x22;
  capturedExpression_26.m_start = "0., WithinRel( chunk.GAM()[0][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_26,(SourceLineInfo *)local_530,capturedExpression_26,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xd9;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x23;
  capturedExpression_27.m_start = "0., WithinRel( chunk.GAM()[0][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_27,(SourceLineInfo *)local_530,capturedExpression_27,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xda;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x25;
  capturedExpression_28.m_start = "1.455, WithinRel( chunk.GAM()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_28,(SourceLineInfo *)local_530,capturedExpression_28,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3ff747ae147ae148;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              local_4e8.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
              .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xdb;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x2b;
  capturedExpression_29.m_start = "1.187354e+3, WithinRel( chunk.GAM()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_29,(SourceLineInfo *)local_530,capturedExpression_29,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x40928d6a7ef9db23;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xdc;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x22;
  capturedExpression_30.m_start = "6., WithinRel( chunk.GAM()[1][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_30,(SourceLineInfo *)local_530,capturedExpression_30,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4018000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xdd;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x22;
  capturedExpression_31.m_start = "7., WithinRel( chunk.GAM()[1][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_31,(SourceLineInfo *)local_530,capturedExpression_31,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x401c000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xde;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x22;
  capturedExpression_32.m_start = "8., WithinRel( chunk.GAM()[1][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_32,(SourceLineInfo *)local_530,capturedExpression_32,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4020000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xdf;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x22;
  capturedExpression_33.m_start = "9., WithinRel( chunk.GAM()[1][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_33,(SourceLineInfo *)local_530,capturedExpression_33,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4022000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe0;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x22;
  capturedExpression_34.m_start = "0., WithinRel( chunk.GAM()[1][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_34,(SourceLineInfo *)local_530,capturedExpression_34,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe1;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x22;
  capturedExpression_35.m_start = "0., WithinRel( chunk.GAM()[1][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_35,(SourceLineInfo *)local_530,capturedExpression_35,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe2;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x22;
  capturedExpression_36.m_start = "0., WithinRel( chunk.GAM()[1][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_36,(SourceLineInfo *)local_530,capturedExpression_36,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe3;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x22;
  capturedExpression_37.m_start = "0., WithinRel( chunk.GAM()[1][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_37,(SourceLineInfo *)local_530,capturedExpression_37,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe4;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x23;
  capturedExpression_38.m_start = "0., WithinRel( chunk.GAM()[1][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_38,(SourceLineInfo *)local_530,capturedExpression_38,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe5;
  macroName_39.m_size = 5;
  macroName_39.m_start = "CHECK";
  capturedExpression_39.m_size = 0x2b;
  capturedExpression_39.m_start = "11 == chunk.resonanceParameters()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_39,(SourceLineInfo *)local_530,capturedExpression_39,
             ContinueOnFailure);
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)local_560,(range_difference_t<D<true>_>)local_530);
  local_580[0]._8_8_ = (long)local_560 - local_558 >> 3;
  local_590._1_1_ = (long)local_560 - local_558 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe6;
  macroName_40.m_size = 5;
  macroName_40.m_start = "CHECK";
  capturedExpression_40.m_size = 0x2b;
  capturedExpression_40.m_start = "11 == chunk.resonanceParameters()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_40,(SourceLineInfo *)local_530,capturedExpression_40,
             ContinueOnFailure);
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)local_560,(range_difference_t<D<true>_>)local_530);
  local_580[0]._8_8_ = (long)local_560 - local_558 >> 3;
  local_590._1_1_ = (long)local_560 - local_558 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe7;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x32;
  capturedExpression_41.m_start = "1., WithinRel( chunk.resonanceParameters()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_41,(SourceLineInfo *)local_530,capturedExpression_41,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3ff0000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              local_4e8.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
              .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe8;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x3b;
  capturedExpression_42.m_start = "9.611086e+5, WithinRel( chunk.resonanceParameters()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_42,(SourceLineInfo *)local_530,capturedExpression_42,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x412d54a933333333;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xe9;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x32;
  capturedExpression_43.m_start = "2., WithinRel( chunk.resonanceParameters()[0][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_43,(SourceLineInfo *)local_530,capturedExpression_43,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4000000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xea;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x32;
  capturedExpression_44.m_start = "3., WithinRel( chunk.resonanceParameters()[0][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_44,(SourceLineInfo *)local_530,capturedExpression_44,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4008000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xeb;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x32;
  capturedExpression_45.m_start = "4., WithinRel( chunk.resonanceParameters()[0][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_45,(SourceLineInfo *)local_530,capturedExpression_45,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4010000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xec;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x32;
  capturedExpression_46.m_start = "5., WithinRel( chunk.resonanceParameters()[0][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_46,(SourceLineInfo *)local_530,capturedExpression_46,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4014000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xed;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x32;
  capturedExpression_47.m_start = "0., WithinRel( chunk.resonanceParameters()[0][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_47,(SourceLineInfo *)local_530,capturedExpression_47,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xee;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x32;
  capturedExpression_48.m_start = "0., WithinRel( chunk.resonanceParameters()[0][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_48,(SourceLineInfo *)local_530,capturedExpression_48,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xef;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x32;
  capturedExpression_49.m_start = "0., WithinRel( chunk.resonanceParameters()[0][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_49,(SourceLineInfo *)local_530,capturedExpression_49,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf0;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x32;
  capturedExpression_50.m_start = "0., WithinRel( chunk.resonanceParameters()[0][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_50,(SourceLineInfo *)local_530,capturedExpression_50,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf1;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x33;
  capturedExpression_51.m_start = "0., WithinRel( chunk.resonanceParameters()[0][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_51,(SourceLineInfo *)local_530,capturedExpression_51,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf2;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x35;
  capturedExpression_52.m_start = "1.455, WithinRel( chunk.resonanceParameters()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_52,(SourceLineInfo *)local_530,capturedExpression_52,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x3ff747ae147ae148;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              local_4e8.
              super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
              .
              super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
              .
              super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
              .
              super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
              .value.
              super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
              .data_.
              super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
              .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf3;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x3b;
  capturedExpression_53.m_start = "1.187354e+3, WithinRel( chunk.resonanceParameters()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_53,(SourceLineInfo *)local_530,capturedExpression_53,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x40928d6a7ef9db23;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf4;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x32;
  capturedExpression_54.m_start = "6., WithinRel( chunk.resonanceParameters()[1][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_54,(SourceLineInfo *)local_530,capturedExpression_54,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4018000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf5;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x32;
  capturedExpression_55.m_start = "7., WithinRel( chunk.resonanceParameters()[1][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_55,(SourceLineInfo *)local_530,capturedExpression_55,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x401c000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf6;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x32;
  capturedExpression_56.m_start = "8., WithinRel( chunk.resonanceParameters()[1][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_56,(SourceLineInfo *)local_530,capturedExpression_56,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4020000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf7;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x32;
  capturedExpression_57.m_start = "9., WithinRel( chunk.resonanceParameters()[1][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_57,(SourceLineInfo *)local_530,capturedExpression_57,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4022000000000000;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf8;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x32;
  capturedExpression_58.m_start = "0., WithinRel( chunk.resonanceParameters()[1][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_58,(SourceLineInfo *)local_530,capturedExpression_58,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xf9;
  macroName_59.m_size = 10;
  macroName_59.m_start = "CHECK_THAT";
  capturedExpression_59.m_size = 0x32;
  capturedExpression_59.m_start = "0., WithinRel( chunk.resonanceParameters()[1][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_59,(SourceLineInfo *)local_530,capturedExpression_59,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xfa;
  macroName_60.m_size = 10;
  macroName_60.m_start = "CHECK_THAT";
  capturedExpression_60.m_size = 0x32;
  capturedExpression_60.m_start = "0., WithinRel( chunk.resonanceParameters()[1][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_60,(SourceLineInfo *)local_530,capturedExpression_60,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xfb;
  macroName_61.m_size = 10;
  macroName_61.m_start = "CHECK_THAT";
  capturedExpression_61.m_size = 0x32;
  capturedExpression_61.m_start = "0., WithinRel( chunk.resonanceParameters()[1][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_61,(SourceLineInfo *)local_530,capturedExpression_61,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xfc;
  macroName_62.m_size = 10;
  macroName_62.m_start = "CHECK_THAT";
  capturedExpression_62.m_size = 0x33;
  capturedExpression_62.m_start = "0., WithinRel( chunk.resonanceParameters()[1][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_62,(SourceLineInfo *)local_530,capturedExpression_62,
             ContinueOnFailure);
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  uVar11 = (long)*ppdVar13 -
           (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start >> 3;
  local_518._8_8_ = (((long)uVar11 / 0xc) / p_Var1->_M_head_impl) * 6;
  local_500 = (double)(ulong)((byte)((byte)(uVar11 / (ulong)local_518._8_8_) ^
                                    uVar11 % (ulong)local_518._8_8_ != 0) & 1);
  local_508 = 9.88131291682493e-324;
  local_4f8._0_2_ = CONCAT11(1,(undefined1)local_4f8);
  local_518._M_allocated_capacity = (size_type)pvVar2;
  ranges::
  view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/CompactRMatrixLimitedUncertainties/ResonanceParameters.hpp:88:20)>_>,_(ranges::cardinality)-1>
  ::operator[]<true,_true,_0,_0>
            ((view_interface<ranges::iter_transform_view<ranges::stride_view<ranges::chunk_view<ranges::ref_view<const_std::vector<double,_std::allocator<double>_>_>_>_>,_ranges::indirected<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_njoy[P]ENDFtk_src_ENDFtk_section_32_151_CompactRMatrixLimitedUncertainties_ResonanceParameters_hpp:88:20)>_>,_(ranges::cardinality)_1>
              *)&local_4e8,(range_difference_t<D<true>_>)local_530);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              (local_4e8.
               super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
               .
               super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
               .
               super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
               .
               super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
               .value.
               super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
               .data_.
               super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
               .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4b8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4b8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xfe;
  macroName_63.m_size = 10;
  macroName_63.m_start = "CHECK_THAT";
  capturedExpression_63.m_size = 0x20;
  capturedExpression_63.m_start = "10., WithinRel( chunk.DER()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_63,(SourceLineInfo *)local_530,capturedExpression_63,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4024000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6]);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0xff;
  macroName_64.m_size = 10;
  macroName_64.m_start = "CHECK_THAT";
  capturedExpression_64.m_size = 0x20;
  capturedExpression_64.m_start = "12., WithinRel( chunk.DER()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_64,(SourceLineInfo *)local_530,capturedExpression_64,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4028000000000000;
  local_590 = (pointer)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)local_590 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  local_588 = (iterator_t<CRng>_conflict1 *)(pdVar3 + lVar9 * 6);
  local_580[0]._0_8_ = lVar9 * 0xc;
  auVar6._8_8_ = (long)local_590 - (long)local_588 >> 0x3f;
  auVar6._0_8_ = (long)local_590 - (long)local_588 >> 3;
  lVar9 = SUB168(auVar6 % SEXT816((long)local_580[0]._0_8_),0);
  local_580[0]._8_8_ = local_580[0]._0_8_ - lVar9;
  if (lVar9 == 0) {
    local_580[0]._8_8_ = 0;
  }
  local_460._M_current = (double *)local_588;
  local_458 = local_598;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_458,&local_460,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_530,*local_460._M_current);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x100;
  macroName_65.m_size = 10;
  macroName_65.m_start = "CHECK_THAT";
  capturedExpression_65.m_size = 0x39;
  capturedExpression_65.m_start = "10., WithinRel( chunk.resonanceEnergyUncertainties()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_65,(SourceLineInfo *)local_530,capturedExpression_65,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4024000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6]);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x101;
  macroName_66.m_size = 10;
  macroName_66.m_start = "CHECK_THAT";
  capturedExpression_66.m_size = 0x39;
  capturedExpression_66.m_start = "12., WithinRel( chunk.resonanceEnergyUncertainties()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_66,(SourceLineInfo *)local_530,capturedExpression_66,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4028000000000000;
  local_590 = (pointer)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)local_590 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  local_588 = (iterator_t<CRng>_conflict1 *)(pdVar3 + lVar9 * 6);
  local_580[0]._0_8_ = lVar9 * 0xc;
  auVar7._8_8_ = (long)local_590 - (long)local_588 >> 0x3f;
  auVar7._0_8_ = (long)local_590 - (long)local_588 >> 3;
  lVar9 = SUB168(auVar7 % SEXT816((long)local_580[0]._0_8_),0);
  local_580[0]._8_8_ = local_580[0]._0_8_ - lVar9;
  if (lVar9 == 0) {
    local_580[0]._8_8_ = 0;
  }
  local_450._M_current = (double *)local_588;
  local_448 = local_598;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_448,&local_450,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_530,*local_450._M_current);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x102;
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  capturedExpression_67.m_size = 0x1c;
  capturedExpression_67.m_start = "11 == chunk.DGAM()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_67,(SourceLineInfo *)local_530,capturedExpression_67,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 6;
  uVar10 = (long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3;
  if (uVar11 < uVar10) {
    uVar10 = uVar11;
  }
  lVar9 = uVar10 * 8 + -8;
  local_518._8_8_ = lVar9 >> 3;
  local_528._1_1_ = lVar9 == 0x58;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 0xb;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x103;
  macroName_68.m_size = 5;
  macroName_68.m_start = "CHECK";
  capturedExpression_68.m_size = 0x1c;
  capturedExpression_68.m_start = "11 == chunk.DGAM()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_68,(SourceLineInfo *)local_530,capturedExpression_68,
             ContinueOnFailure);
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_3f8 = &local_4f0;
  local_400 = &local_528;
  local_420.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_420.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_420.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_420.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_400,&local_420,1);
  dVar12 = (double)((long)local_420.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                          .data_.
                          super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                          .value.end_._M_current -
                    (long)local_420.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                          .data_.
                          super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                          .value._M_current >> 3);
  if ((ulong)local_420.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < (ulong)dVar12) {
    dVar12 = (double)local_420.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                     .value.n_;
  }
  lVar9 = (long)dVar12 * 8 + -8;
  local_580[0]._8_8_ = lVar9 >> 3;
  local_590._1_1_ = lVar9 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x104;
  macroName_69.m_size = 10;
  macroName_69.m_start = "CHECK_THAT";
  capturedExpression_69.m_size = 0x24;
  capturedExpression_69.m_start = "13., WithinRel( chunk.DGAM()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_69,(SourceLineInfo *)local_530,capturedExpression_69,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402a000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 1])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x105;
  macroName_70.m_size = 10;
  macroName_70.m_start = "CHECK_THAT";
  capturedExpression_70.m_size = 0x24;
  capturedExpression_70.m_start = "14., WithinRel( chunk.DGAM()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_70,(SourceLineInfo *)local_530,capturedExpression_70,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402c000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 2])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x106;
  macroName_71.m_size = 10;
  macroName_71.m_start = "CHECK_THAT";
  capturedExpression_71.m_size = 0x24;
  capturedExpression_71.m_start = "15., WithinRel( chunk.DGAM()[0][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_71,(SourceLineInfo *)local_530,capturedExpression_71,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402e000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 3])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x107;
  macroName_72.m_size = 10;
  macroName_72.m_start = "CHECK_THAT";
  capturedExpression_72.m_size = 0x24;
  capturedExpression_72.m_start = "16., WithinRel( chunk.DGAM()[0][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_72,(SourceLineInfo *)local_530,capturedExpression_72,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4030000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 4])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x108;
  macroName_73.m_size = 10;
  macroName_73.m_start = "CHECK_THAT";
  capturedExpression_73.m_size = 0x24;
  capturedExpression_73.m_start = "17., WithinRel( chunk.DGAM()[0][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_73,(SourceLineInfo *)local_530,capturedExpression_73,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4031000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 5])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x109;
  macroName_74.m_size = 10;
  macroName_74.m_start = "CHECK_THAT";
  capturedExpression_74.m_size = 0x24;
  capturedExpression_74.m_start = "18., WithinRel( chunk.DGAM()[0][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_74,(SourceLineInfo *)local_530,capturedExpression_74,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4032000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 6])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10a;
  macroName_75.m_size = 10;
  macroName_75.m_start = "CHECK_THAT";
  capturedExpression_75.m_size = 0x23;
  capturedExpression_75.m_start = "0., WithinRel( chunk.DGAM()[0][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_75,(SourceLineInfo *)local_530,capturedExpression_75,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 7])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10b;
  macroName_76.m_size = 10;
  macroName_76.m_start = "CHECK_THAT";
  capturedExpression_76.m_size = 0x23;
  capturedExpression_76.m_start = "0., WithinRel( chunk.DGAM()[0][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_76,(SourceLineInfo *)local_530,capturedExpression_76,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 8])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10c;
  macroName_77.m_size = 10;
  macroName_77.m_start = "CHECK_THAT";
  capturedExpression_77.m_size = 0x23;
  capturedExpression_77.m_start = "0., WithinRel( chunk.DGAM()[0][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_77,(SourceLineInfo *)local_530,capturedExpression_77,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 9])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10d;
  macroName_78.m_size = 10;
  macroName_78.m_start = "CHECK_THAT";
  capturedExpression_78.m_size = 0x23;
  capturedExpression_78.m_start = "0., WithinRel( chunk.DGAM()[0][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_78,(SourceLineInfo *)local_530,capturedExpression_78,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 10]
            );
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10e;
  macroName_79.m_size = 10;
  macroName_79.m_start = "CHECK_THAT";
  capturedExpression_79.m_size = 0x24;
  capturedExpression_79.m_start = "0., WithinRel( chunk.DGAM()[0][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_79,(SourceLineInfo *)local_530,capturedExpression_79,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 0xb
                   ]);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x10f;
  macroName_80.m_size = 10;
  macroName_80.m_start = "CHECK_THAT";
  capturedExpression_80.m_size = 0x24;
  capturedExpression_80.m_start = "19., WithinRel( chunk.DGAM()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_80,(SourceLineInfo *)local_530,capturedExpression_80,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4033000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_3c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_3a0 = &local_528;
  local_398 = &local_4f0;
  local_3c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_3c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_3c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_3a0,&local_3c0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_3c0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x110;
  macroName_81.m_size = 10;
  macroName_81.m_start = "CHECK_THAT";
  capturedExpression_81.m_size = 0x24;
  capturedExpression_81.m_start = "20., WithinRel( chunk.DGAM()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_81,(SourceLineInfo *)local_530,capturedExpression_81,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4034000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_390.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_370 = &local_528;
  local_368 = &local_4f0;
  local_390.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_390.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_390.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_370,&local_390,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_390.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x111;
  macroName_82.m_size = 10;
  macroName_82.m_start = "CHECK_THAT";
  capturedExpression_82.m_size = 0x24;
  capturedExpression_82.m_start = "21., WithinRel( chunk.DGAM()[1][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_82,(SourceLineInfo *)local_530,capturedExpression_82,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4035000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_360.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_340 = &local_528;
  local_338 = &local_4f0;
  local_360.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_360.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_360.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_340,&local_360,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_360.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x112;
  macroName_83.m_size = 10;
  macroName_83.m_start = "CHECK_THAT";
  capturedExpression_83.m_size = 0x24;
  capturedExpression_83.m_start = "22., WithinRel( chunk.DGAM()[1][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_83,(SourceLineInfo *)local_530,capturedExpression_83,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4036000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_330.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_310 = &local_528;
  local_308 = &local_4f0;
  local_330.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_330.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_330.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_310,&local_330,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_330.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x113;
  macroName_84.m_size = 10;
  macroName_84.m_start = "CHECK_THAT";
  capturedExpression_84.m_size = 0x24;
  capturedExpression_84.m_start = "23., WithinRel( chunk.DGAM()[1][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_84,(SourceLineInfo *)local_530,capturedExpression_84,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4037000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_300.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_2e0 = &local_528;
  local_2d8 = &local_4f0;
  local_300.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_300.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_300.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2e0,&local_300,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_300.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x114;
  macroName_85.m_size = 10;
  macroName_85.m_start = "CHECK_THAT";
  capturedExpression_85.m_size = 0x24;
  capturedExpression_85.m_start = "24., WithinRel( chunk.DGAM()[1][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_85,(SourceLineInfo *)local_530,capturedExpression_85,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4038000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_2d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_2b0 = &local_528;
  local_2a8 = &local_4f0;
  local_2d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_2d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_2d0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_2b0,&local_2d0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_2d0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x115;
  macroName_86.m_size = 10;
  macroName_86.m_start = "CHECK_THAT";
  capturedExpression_86.m_size = 0x23;
  capturedExpression_86.m_start = "0., WithinRel( chunk.DGAM()[1][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_86,(SourceLineInfo *)local_530,capturedExpression_86,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_2a0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_280 = &local_528;
  local_278 = &local_4f0;
  local_2a0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_2a0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_2a0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_280,&local_2a0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_2a0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x116;
  macroName_87.m_size = 10;
  macroName_87.m_start = "CHECK_THAT";
  capturedExpression_87.m_size = 0x23;
  capturedExpression_87.m_start = "0., WithinRel( chunk.DGAM()[1][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_87,(SourceLineInfo *)local_530,capturedExpression_87,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_270.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_250 = &local_528;
  local_248 = &local_4f0;
  local_270.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_270.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_270.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_250,&local_270,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_270.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x117;
  macroName_88.m_size = 10;
  macroName_88.m_start = "CHECK_THAT";
  capturedExpression_88.m_size = 0x23;
  capturedExpression_88.m_start = "0., WithinRel( chunk.DGAM()[1][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_88,(SourceLineInfo *)local_530,capturedExpression_88,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_240.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_220 = &local_528;
  local_218 = &local_4f0;
  local_240.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_240.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_240.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_220,&local_240,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_240.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x118;
  macroName_89.m_size = 10;
  macroName_89.m_start = "CHECK_THAT";
  capturedExpression_89.m_size = 0x23;
  capturedExpression_89.m_start = "0., WithinRel( chunk.DGAM()[1][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_89,(SourceLineInfo *)local_530,capturedExpression_89,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_210.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_1f0 = &local_528;
  local_1e8 = &local_4f0;
  local_210.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_210.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_210.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1f0,&local_210,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_210.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x119;
  macroName_90.m_size = 10;
  macroName_90.m_start = "CHECK_THAT";
  capturedExpression_90.m_size = 0x24;
  capturedExpression_90.m_start = "0., WithinRel( chunk.DGAM()[1][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_90,(SourceLineInfo *)local_530,capturedExpression_90,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_1e0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_1c0 = &local_528;
  local_1b8 = &local_4f0;
  local_1e0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_1e0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_1e0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1c0,&local_1e0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_1e0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x58));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11a;
  macroName_91.m_size = 5;
  macroName_91.m_start = "CHECK";
  capturedExpression_91.m_size = 0x37;
  capturedExpression_91.m_start = "11 == chunk.resonanceParameterUncertainties()[0].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_91,(SourceLineInfo *)local_530,capturedExpression_91,
             ContinueOnFailure);
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  uVar11 = lVar9 * 6;
  uVar10 = (long)*ppdVar13 - (long)(pdVar3 + lVar9 * 6) >> 3;
  if (uVar11 < uVar10) {
    uVar10 = uVar11;
  }
  lVar9 = uVar10 * 8 + -8;
  local_518._8_8_ = lVar9 >> 3;
  local_528._1_1_ = lVar9 == 0x58;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_528._4_4_ = 0xb;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11b;
  macroName_92.m_size = 5;
  macroName_92.m_start = "CHECK";
  capturedExpression_92.m_size = 0x37;
  capturedExpression_92.m_start = "11 == chunk.resonanceParameterUncertainties()[1].size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_92,(SourceLineInfo *)local_530,capturedExpression_92,
             ContinueOnFailure);
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_3f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_3d0 = &local_528;
  local_3c8 = &local_4f0;
  local_3f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_3f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_3f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_3d0,&local_3f0,1);
  dVar12 = (double)((long)local_3f0.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                          .data_.
                          super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                          .value.end_._M_current -
                    (long)local_3f0.
                          super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                          .
                          super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                          .
                          super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                          .
                          super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                          .value.
                          super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                          .data_.
                          super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                          .value._M_current >> 3);
  if ((ulong)local_3f0.
             super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
             .
             super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
             .
             super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
             .
             super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
             .value.
             super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
             .data_.
             super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
             .value.n_ < (ulong)dVar12) {
    dVar12 = (double)local_3f0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
                     .value.n_;
  }
  lVar9 = (long)dVar12 * 8 + -8;
  local_580[0]._8_8_ = lVar9 >> 3;
  local_590._1_1_ = lVar9 == 0x58;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3a0;
  local_590._4_4_ = 0xb;
  local_588 = (iterator_t<CRng>_conflict1 *)0x19e92a;
  local_580[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11c;
  macroName_93.m_size = 10;
  macroName_93.m_start = "CHECK_THAT";
  capturedExpression_93.m_size = 0x3f;
  capturedExpression_93.m_start = "13., WithinRel( chunk.resonanceParameterUncertainties()[0][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_93,(SourceLineInfo *)local_530,capturedExpression_93,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402a000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 1])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11d;
  macroName_94.m_size = 10;
  macroName_94.m_start = "CHECK_THAT";
  capturedExpression_94.m_size = 0x3f;
  capturedExpression_94.m_start = "14., WithinRel( chunk.resonanceParameterUncertainties()[0][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_94,(SourceLineInfo *)local_530,capturedExpression_94,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402c000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 2])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11e;
  macroName_95.m_size = 10;
  macroName_95.m_start = "CHECK_THAT";
  capturedExpression_95.m_size = 0x3f;
  capturedExpression_95.m_start = "15., WithinRel( chunk.resonanceParameterUncertainties()[0][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_95,(SourceLineInfo *)local_530,capturedExpression_95,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x402e000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 3])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x11f;
  macroName_96.m_size = 10;
  macroName_96.m_start = "CHECK_THAT";
  capturedExpression_96.m_size = 0x3f;
  capturedExpression_96.m_start = "16., WithinRel( chunk.resonanceParameterUncertainties()[0][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_96,(SourceLineInfo *)local_530,capturedExpression_96,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4030000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 4])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x120;
  macroName_97.m_size = 10;
  macroName_97.m_start = "CHECK_THAT";
  capturedExpression_97.m_size = 0x3f;
  capturedExpression_97.m_start = "17., WithinRel( chunk.resonanceParameterUncertainties()[0][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_97,(SourceLineInfo *)local_530,capturedExpression_97,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4031000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 5])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x121;
  macroName_98.m_size = 10;
  macroName_98.m_start = "CHECK_THAT";
  capturedExpression_98.m_size = 0x3f;
  capturedExpression_98.m_start = "18., WithinRel( chunk.resonanceParameterUncertainties()[0][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_98,(SourceLineInfo *)local_530,capturedExpression_98,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x4032000000000000;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 6])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x122;
  macroName_99.m_size = 10;
  macroName_99.m_start = "CHECK_THAT";
  capturedExpression_99.m_size = 0x3e;
  capturedExpression_99.m_start = "0., WithinRel( chunk.resonanceParameterUncertainties()[0][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_99,(SourceLineInfo *)local_530,capturedExpression_99,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 7])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x123;
  macroName_x00100.m_size = 10;
  macroName_x00100.m_start = "CHECK_THAT";
  capturedExpression_x00100.m_size = 0x3e;
  capturedExpression_x00100.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[0][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00100,(SourceLineInfo *)local_530,capturedExpression_x00100,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 8])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x124;
  macroName_x00101.m_size = 10;
  macroName_x00101.m_start = "CHECK_THAT";
  capturedExpression_x00101.m_size = 0x3e;
  capturedExpression_x00101.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[0][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00101,(SourceLineInfo *)local_530,capturedExpression_x00101,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 9])
  ;
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x125;
  macroName_x00102.m_size = 10;
  macroName_x00102.m_start = "CHECK_THAT";
  capturedExpression_x00102.m_size = 0x3e;
  capturedExpression_x00102.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[0][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00102,(SourceLineInfo *)local_530,capturedExpression_x00102,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 10]
            );
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x126;
  macroName_x00103.m_size = 10;
  macroName_x00103.m_start = "CHECK_THAT";
  capturedExpression_x00103.m_size = 0x3f;
  capturedExpression_x00103.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[0][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00103,(SourceLineInfo *)local_530,capturedExpression_x00103,
             ContinueOnFailure);
  local_560 = (undefined1  [8])0x0;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_530,
             pdVar3[((((long)*ppdVar13 - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl) * 6 + 0xb
                   ]);
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_530,(double *)local_560);
  local_590._1_1_ = bVar8;
  local_590._0_1_ = true;
  local_598 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_588 = (iterator_t<CRng>_conflict1 *)local_560;
  local_580[0]._0_8_ = (WithinRelMatcher *)local_530;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_598);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_598);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x127;
  macroName_x00104.m_size = 10;
  macroName_x00104.m_start = "CHECK_THAT";
  capturedExpression_x00104.m_size = 0x3f;
  capturedExpression_x00104.m_start =
       "19., WithinRel( chunk.resonanceParameterUncertainties()[1][0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00104,(SourceLineInfo *)local_530,capturedExpression_x00104,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4033000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_1b0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_190 = &local_528;
  local_188 = &local_4f0;
  local_1b0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_1b0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_1b0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_190,&local_1b0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_1b0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 8));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x128;
  macroName_x00105.m_size = 10;
  macroName_x00105.m_start = "CHECK_THAT";
  capturedExpression_x00105.m_size = 0x3f;
  capturedExpression_x00105.m_start =
       "20., WithinRel( chunk.resonanceParameterUncertainties()[1][1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00105,(SourceLineInfo *)local_530,capturedExpression_x00105,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4034000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_180.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_160 = &local_528;
  local_158 = &local_4f0;
  local_180.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_180.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_180.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_160,&local_180,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_180.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x10));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x129;
  macroName_x00106.m_size = 10;
  macroName_x00106.m_start = "CHECK_THAT";
  capturedExpression_x00106.m_size = 0x3f;
  capturedExpression_x00106.m_start =
       "21., WithinRel( chunk.resonanceParameterUncertainties()[1][2] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00106,(SourceLineInfo *)local_530,capturedExpression_x00106,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4035000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_150.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_130 = &local_528;
  local_128 = &local_4f0;
  local_150.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_150.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_150.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_130,&local_150,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_150.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x18));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12a;
  macroName_x00107.m_size = 10;
  macroName_x00107.m_start = "CHECK_THAT";
  capturedExpression_x00107.m_size = 0x3f;
  capturedExpression_x00107.m_start =
       "22., WithinRel( chunk.resonanceParameterUncertainties()[1][3] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00107,(SourceLineInfo *)local_530,capturedExpression_x00107,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4036000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_100 = &local_528;
  local_f8 = &local_4f0;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_120.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_100,&local_120,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_120.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x20));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12b;
  macroName_x00108.m_size = 10;
  macroName_x00108.m_start = "CHECK_THAT";
  capturedExpression_x00108.m_size = 0x3f;
  capturedExpression_x00108.m_start =
       "23., WithinRel( chunk.resonanceParameterUncertainties()[1][4] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00108,(SourceLineInfo *)local_530,capturedExpression_x00108,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4037000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_d0 = &local_528;
  local_c8 = &local_4f0;
  local_f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_f0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d0,&local_f0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_f0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x28));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12c;
  macroName_x00109.m_size = 10;
  macroName_x00109.m_start = "CHECK_THAT";
  capturedExpression_x00109.m_size = 0x3f;
  capturedExpression_x00109.m_start =
       "24., WithinRel( chunk.resonanceParameterUncertainties()[1][5] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00109,(SourceLineInfo *)local_530,capturedExpression_x00109,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x4038000000000000;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_a0 = &local_528;
  local_98 = &local_4f0;
  local_c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_c0.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_a0,&local_c0,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_c0.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x30));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12d;
  macroName_x00110.m_size = 10;
  macroName_x00110.m_start = "CHECK_THAT";
  capturedExpression_x00110.m_size = 0x3e;
  capturedExpression_x00110.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[1][6] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00110,(SourceLineInfo *)local_530,capturedExpression_x00110,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_90.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_70 = &local_528;
  local_68 = &local_4f0;
  local_90.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_90.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_90.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_70,&local_90,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_90.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x38));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12e;
  macroName_x00111.m_size = 10;
  macroName_x00111.m_start = "CHECK_THAT";
  capturedExpression_x00111.m_size = 0x3e;
  capturedExpression_x00111.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[1][7] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00111,(SourceLineInfo *)local_530,capturedExpression_x00111,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_60.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_40 = &local_528;
  local_38 = &local_4f0;
  local_60.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_60.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_60.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_40,&local_60,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_60.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x40));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x12f;
  macroName_x00112.m_size = 10;
  macroName_x00112.m_start = "CHECK_THAT";
  capturedExpression_x00112.m_size = 0x3e;
  capturedExpression_x00112.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[1][8] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00112,(SourceLineInfo *)local_530,capturedExpression_x00112,
             ContinueOnFailure);
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (double *)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_498 = &local_528;
  local_490 = &local_4f0;
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_4b8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_498,&local_4b8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_4b8.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x48));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_4e8);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = (ITransientExpression *)&local_4e8;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x130;
  macroName_x00113.m_size = 10;
  macroName_x00113.m_start = "CHECK_THAT";
  capturedExpression_x00113.m_size = 0x3e;
  capturedExpression_x00113.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[1][9] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00113,(SourceLineInfo *)local_530,capturedExpression_x00113,
             ContinueOnFailure);
  local_440._vptr_ITransientExpression = (_func_int **)0x0;
  local_518._M_allocated_capacity = (size_type)*ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)(local_518._M_allocated_capacity - (long)pdVar3) >> 3) / 0xc) /
          p_Var1->_M_head_impl;
  local_508 = (double)(lVar9 * 6);
  local_518._8_8_ = pdVar3 + lVar9 * 6;
  uVar11 = (long)(local_518._M_allocated_capacity - local_518._8_8_) >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_508) ^ uVar11 % (ulong)local_508 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.super_box<long,_void,_(ranges::detail::box_compress)0>.value = 0;
  local_4c8 = &local_528;
  local_4c0 = &local_4f0;
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
  .value._M_current =
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
       local_518._8_8_;
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.n_ = (range_difference_t<CRng>)local_508;
  local_4e8.
  super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
  .
  super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
  .
  super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
  .
  super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
  .value.
  super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
  .data_.
  super_box<ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_std::integral_constant<unsigned_long,_1UL>,_(ranges::detail::box_compress)0>
  .value.end_._M_current = (double *)local_518._M_allocated_capacity;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_4c8,&local_4e8,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,
             *(double *)
              ((long)local_4e8.
                     super_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_readable_iterator_associated_types_base<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void>
                     .
                     super_mixin_base_t<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>,_true>::adaptor<true>_>_>
                     .
                     super_basic_mixin<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>_>
                     .
                     super_box<ranges::adaptor_cursor<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>_>,_void,_(ranges::detail::box_compress)0>
                     .value.
                     super_adaptor_value_type_<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_ranges::chunk_view_<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,___gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_(ranges::subrange_kind)1>,_true>::adaptor<true>,_0>
                     .data_.
                     super_box<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>,_std::integral_constant<unsigned_long,_0UL>,_(ranges::detail::box_compress)0>
                     .value._M_current + 0x50));
  bVar8 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_598,(double *)&local_440);
  local_558._1_1_ = bVar8;
  local_558._0_1_ = true;
  local_560 = (undefined1  [8])&PTR_streamReconstructedExpression_001da3e0;
  local_550 = &local_440;
  local_548._M_current = (double *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_560);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_560);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x131;
  macroName_x00114.m_size = 10;
  macroName_x00114.m_start = "CHECK_THAT";
  capturedExpression_x00114.m_size = 0x3f;
  capturedExpression_x00114.m_start =
       "0., WithinRel( chunk.resonanceParameterUncertainties()[1][10] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00114,(SourceLineInfo *)local_530,capturedExpression_x00114,
             ContinueOnFailure);
  local_488 = 0.0;
  local_548._M_current = *ppdVar13;
  pdVar3 = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar9 = (((long)local_548._M_current - (long)pdVar3 >> 3) / 0xc) / p_Var1->_M_head_impl;
  local_550 = (ITransientExpression *)(lVar9 * 6);
  local_560 = (undefined1  [8])(pdVar3 + lVar9 * 6);
  uVar11 = (long)local_548._M_current - (long)local_560 >> 3;
  local_4f8 = (ulong)((byte)((byte)(uVar11 / (ulong)local_550) ^ uVar11 % (ulong)local_550 != 0) & 1
                     );
  local_500 = 9.88131291682493e-324;
  local_4ef = 1;
  local_558 = 0;
  local_540 = &local_528;
  local_538 = &local_4f0;
  local_518._M_allocated_capacity = (size_type)local_548._M_current;
  local_518._8_8_ = local_560;
  local_508 = (double)local_550;
  ranges::
  stride_view<ranges::chunk_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_540,(iterator_t<CRng>_conflict1 *)local_560,1);
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_598,(double)*(_func_int **)((long)local_560 + 0x58));
  local_440.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_598,&local_488);
  local_440.m_isBinaryExpression = true;
  local_440._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001da3e0;
  local_430 = &local_488;
  local_428 = (WithinRelMatcher *)local_598;
  Catch::AssertionHandler::handleExpr(&local_5e0,&local_440);
  Catch::ITransientExpression::~ITransientExpression(&local_440);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_598);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_530 = (undefined1  [8])0x19c494;
  local_528 = (pointer)0x133;
  macroName_x00115.m_size = 5;
  macroName_x00115.m_start = "CHECK";
  capturedExpression_x00115.m_size = 0xf;
  capturedExpression_x00115.m_start = "9 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_5e0,macroName_x00115,(SourceLineInfo *)local_530,capturedExpression_x00115,
             ContinueOnFailure);
  local_518._8_8_ =
       (((long)*ppdVar13 -
         (long)(pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_528._1_1_ = local_518._8_8_ == 9;
  local_528._0_1_ = true;
  local_530 = (undefined1  [8])&PTR_streamReconstructedExpression_001da360;
  local_528._4_4_ = 9;
  local_520 = "==";
  local_518._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_5e0,(ITransientExpression *)local_530);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_530);
  Catch::AssertionHandler::complete(&local_5e0);
  if (local_5e0.m_completed == false) {
    (*(local_5e0.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const ResonanceParameters& chunk ) {

  CHECK( 2 == chunk.NRSA() );
  CHECK( 2 == chunk.numberResonances() );
  CHECK( 4 == chunk.NX() );
  CHECK( 4 == chunk.numberLines() );

  CHECK( 2 == chunk.ER().size() );
  CHECK( 2 == chunk.resonanceEnergies().size() );
  CHECK( 2 == chunk.GAM().size() );
  CHECK( 2 == chunk.resonanceParameters().size() );
  CHECK( 2 == chunk.DER().size() );
  CHECK( 2 == chunk.resonanceEnergyUncertainties().size() );
  CHECK( 2 == chunk.DGAM().size() );
  CHECK( 2 == chunk.resonanceParameterUncertainties().size() );

  CHECK_THAT( -1.223300e+6, WithinRel( chunk.ER()[0] ) );
  CHECK_THAT(  7.788000e+3, WithinRel( chunk.ER()[1] ) );
  CHECK_THAT( -1.223300e+6, WithinRel( chunk.resonanceEnergies()[0] ) );
  CHECK_THAT(  7.788000e+3, WithinRel( chunk.resonanceEnergies()[1] ) );
  CHECK( 11 == chunk.GAM()[0].size() );
  CHECK( 11 == chunk.GAM()[1].size() );
  CHECK_THAT( 1., WithinRel( chunk.GAM()[0][0] ) );
  CHECK_THAT( 9.611086e+5, WithinRel( chunk.GAM()[0][1] ) );
  CHECK_THAT( 2., WithinRel( chunk.GAM()[0][2] ) );
  CHECK_THAT( 3., WithinRel( chunk.GAM()[0][3] ) );
  CHECK_THAT( 4., WithinRel( chunk.GAM()[0][4] ) );
  CHECK_THAT( 5., WithinRel( chunk.GAM()[0][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[0][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[0][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[0][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[0][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[0][10] ) );
  CHECK_THAT( 1.455, WithinRel( chunk.GAM()[1][0] ) );
  CHECK_THAT( 1.187354e+3, WithinRel( chunk.GAM()[1][1] ) );
  CHECK_THAT( 6., WithinRel( chunk.GAM()[1][2] ) );
  CHECK_THAT( 7., WithinRel( chunk.GAM()[1][3] ) );
  CHECK_THAT( 8., WithinRel( chunk.GAM()[1][4] ) );
  CHECK_THAT( 9., WithinRel( chunk.GAM()[1][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[1][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[1][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[1][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[1][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.GAM()[1][10] ) );
  CHECK( 11 == chunk.resonanceParameters()[0].size() );
  CHECK( 11 == chunk.resonanceParameters()[1].size() );
  CHECK_THAT( 1., WithinRel( chunk.resonanceParameters()[0][0] ) );
  CHECK_THAT( 9.611086e+5, WithinRel( chunk.resonanceParameters()[0][1] ) );
  CHECK_THAT( 2., WithinRel( chunk.resonanceParameters()[0][2] ) );
  CHECK_THAT( 3., WithinRel( chunk.resonanceParameters()[0][3] ) );
  CHECK_THAT( 4., WithinRel( chunk.resonanceParameters()[0][4] ) );
  CHECK_THAT( 5., WithinRel( chunk.resonanceParameters()[0][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[0][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[0][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[0][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[0][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[0][10] ) );
  CHECK_THAT( 1.455, WithinRel( chunk.resonanceParameters()[1][0] ) );
  CHECK_THAT( 1.187354e+3, WithinRel( chunk.resonanceParameters()[1][1] ) );
  CHECK_THAT( 6., WithinRel( chunk.resonanceParameters()[1][2] ) );
  CHECK_THAT( 7., WithinRel( chunk.resonanceParameters()[1][3] ) );
  CHECK_THAT( 8., WithinRel( chunk.resonanceParameters()[1][4] ) );
  CHECK_THAT( 9., WithinRel( chunk.resonanceParameters()[1][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[1][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[1][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[1][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[1][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameters()[1][10] ) );

  CHECK_THAT( 10., WithinRel( chunk.DER()[0] ) );
  CHECK_THAT( 12., WithinRel( chunk.DER()[1] ) );
  CHECK_THAT( 10., WithinRel( chunk.resonanceEnergyUncertainties()[0] ) );
  CHECK_THAT( 12., WithinRel( chunk.resonanceEnergyUncertainties()[1] ) );
  CHECK( 11 == chunk.DGAM()[0].size() );
  CHECK( 11 == chunk.DGAM()[1].size() );
  CHECK_THAT( 13., WithinRel( chunk.DGAM()[0][0] ) );
  CHECK_THAT( 14., WithinRel( chunk.DGAM()[0][1] ) );
  CHECK_THAT( 15., WithinRel( chunk.DGAM()[0][2] ) );
  CHECK_THAT( 16., WithinRel( chunk.DGAM()[0][3] ) );
  CHECK_THAT( 17., WithinRel( chunk.DGAM()[0][4] ) );
  CHECK_THAT( 18., WithinRel( chunk.DGAM()[0][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[0][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[0][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[0][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[0][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[0][10] ) );
  CHECK_THAT( 19., WithinRel( chunk.DGAM()[1][0] ) );
  CHECK_THAT( 20., WithinRel( chunk.DGAM()[1][1] ) );
  CHECK_THAT( 21., WithinRel( chunk.DGAM()[1][2] ) );
  CHECK_THAT( 22., WithinRel( chunk.DGAM()[1][3] ) );
  CHECK_THAT( 23., WithinRel( chunk.DGAM()[1][4] ) );
  CHECK_THAT( 24., WithinRel( chunk.DGAM()[1][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[1][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[1][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[1][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[1][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.DGAM()[1][10] ) );
  CHECK( 11 == chunk.resonanceParameterUncertainties()[0].size() );
  CHECK( 11 == chunk.resonanceParameterUncertainties()[1].size() );
  CHECK_THAT( 13., WithinRel( chunk.resonanceParameterUncertainties()[0][0] ) );
  CHECK_THAT( 14., WithinRel( chunk.resonanceParameterUncertainties()[0][1] ) );
  CHECK_THAT( 15., WithinRel( chunk.resonanceParameterUncertainties()[0][2] ) );
  CHECK_THAT( 16., WithinRel( chunk.resonanceParameterUncertainties()[0][3] ) );
  CHECK_THAT( 17., WithinRel( chunk.resonanceParameterUncertainties()[0][4] ) );
  CHECK_THAT( 18., WithinRel( chunk.resonanceParameterUncertainties()[0][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[0][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[0][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[0][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[0][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[0][10] ) );
  CHECK_THAT( 19., WithinRel( chunk.resonanceParameterUncertainties()[1][0] ) );
  CHECK_THAT( 20., WithinRel( chunk.resonanceParameterUncertainties()[1][1] ) );
  CHECK_THAT( 21., WithinRel( chunk.resonanceParameterUncertainties()[1][2] ) );
  CHECK_THAT( 22., WithinRel( chunk.resonanceParameterUncertainties()[1][3] ) );
  CHECK_THAT( 23., WithinRel( chunk.resonanceParameterUncertainties()[1][4] ) );
  CHECK_THAT( 24., WithinRel( chunk.resonanceParameterUncertainties()[1][5] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[1][6] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[1][7] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[1][8] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[1][9] ) );
  CHECK_THAT( 0., WithinRel( chunk.resonanceParameterUncertainties()[1][10] ) );

  CHECK( 9 == chunk.NC() );
}